

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q2_K_ref(float *x,block_q2_K *y,int64_t k)

{
  byte bVar1;
  ggml_fp16_t gVar2;
  int iVar3;
  float fVar4;
  long lVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  float fVar7;
  int l_4;
  int j_5;
  int l_3;
  int ii;
  float dm;
  float d;
  int j_4;
  int l_2;
  int j_3;
  float iscale_1;
  int j_2;
  int l_1;
  int j_1;
  float iscale;
  float min;
  float scale;
  int l;
  int j;
  float max_min;
  float max_scale;
  int i;
  float q4scale;
  float scales [16];
  float mins [16];
  float weights [16];
  uint8_t Laux [16];
  uint8_t L [256];
  int nb;
  float in_stack_fffffffffffffda4;
  float local_258;
  float local_254;
  int local_250;
  int local_24c;
  int local_244;
  int local_238;
  int local_230;
  int local_228;
  int local_220;
  int local_210;
  int local_20c;
  float local_208;
  float local_204;
  int local_200;
  float fStack_1f8;
  undefined1 in_stack_fffffffffffffe0f;
  float in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  float *in_stack_fffffffffffffe18;
  uint8_t *in_stack_fffffffffffffe20;
  float *in_stack_fffffffffffffe28;
  float *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  float local_1b8 [2];
  uint8_t *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  uint local_178 [20];
  byte local_128 [268];
  int local_1c;
  long local_10;
  long local_8;
  
  local_1c = (int)(in_RDX / 0x100);
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_200 = 0; local_200 < local_1c; local_200 = local_200 + 1) {
    local_204 = 0.0;
    local_208 = 0.0;
    for (local_20c = 0; local_20c < 0x10; local_20c = local_20c + 1) {
      for (local_210 = 0; local_210 < 0x10; local_210 = local_210 + 1) {
        local_178[local_210] =
             *(uint *)(local_8 + (long)(local_20c * 0x10 + local_210) * 4) & 0x7fffffff;
      }
      fVar6 = make_qkx2_quants(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                               in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe14,
                               in_stack_fffffffffffffe10,in_stack_fffffffffffffe58,
                               (_Bool)in_stack_fffffffffffffe0f);
      (&fStack_1f8)[local_20c] = fVar6;
      if (local_204 < (&fStack_1f8)[local_20c]) {
        local_204 = (&fStack_1f8)[local_20c];
      }
      if (local_208 < local_1b8[local_20c]) {
        local_208 = local_1b8[local_20c];
      }
    }
    if (local_204 <= 0.0) {
      for (local_228 = 0; local_228 < 0x10; local_228 = local_228 + 1) {
        *(undefined1 *)(local_10 + (long)local_200 * 0x54 + (long)local_228) = 0;
      }
      gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffda4);
      *(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x50) = gVar2;
    }
    else {
      for (local_220 = 0; local_220 < 0x10; local_220 = local_220 + 1) {
        iVar3 = nearest_int((15.0 / local_204) * (&fStack_1f8)[local_220]);
        *(char *)(local_10 + (long)local_200 * 0x54 + (long)local_220) = (char)iVar3;
      }
      gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffda4);
      *(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x50) = gVar2;
    }
    if (local_208 <= 0.0) {
      gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffda4);
      *(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x52) = gVar2;
    }
    else {
      for (local_230 = 0; local_230 < 0x10; local_230 = local_230 + 1) {
        iVar3 = nearest_int((15.0 / local_208) * local_1b8[local_230]);
        lVar5 = local_10 + (long)local_200 * 0x54;
        *(byte *)(lVar5 + local_230) = *(byte *)(lVar5 + local_230) | (byte)(iVar3 << 4);
      }
      gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffda4);
      *(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x52) = gVar2;
    }
    for (local_238 = 0; local_238 < 0x10; local_238 = local_238 + 1) {
      fVar6 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x50));
      fVar6 = fVar6 * (float)(*(byte *)(local_10 + (long)local_200 * 0x54 + (long)local_238) & 0xf);
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        fVar7 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)local_200 * 0x54 + 0x52))
        ;
        bVar1 = *(byte *)(local_10 + (long)local_200 * 0x54 + (long)local_238);
        for (local_244 = 0; local_244 < 0x10; local_244 = local_244 + 1) {
          fVar4 = (float)nearest_int((*(float *)(local_8 + (long)(local_238 * 0x10 + local_244) * 4)
                                     + fVar7 * (float)((int)(uint)bVar1 >> 4)) / fVar6);
          local_254 = fVar4;
          if (3 < (int)fVar4) {
            local_254 = 4.2039e-45;
          }
          if ((int)local_254 < 0) {
            local_258 = 0.0;
            fVar4 = in_stack_fffffffffffffda4;
          }
          else {
            local_258 = fVar4;
            if (3 < (int)fVar4) {
              fVar4 = 4.2039e-45;
              local_258 = fVar4;
            }
          }
          local_128[local_238 * 0x10 + local_244] = SUB41(local_258,0);
          in_stack_fffffffffffffda4 = fVar4;
        }
      }
    }
    for (local_24c = 0; local_24c < 0x100; local_24c = local_24c + 0x80) {
      for (local_250 = 0; local_250 < 0x20; local_250 = local_250 + 1) {
        *(byte *)(local_10 + (long)local_200 * 0x54 + 0x10 + (long)(local_24c / 4 + local_250)) =
             local_128[local_24c + local_250] | local_128[local_24c + local_250 + 0x20] << 2 |
             local_128[local_24c + local_250 + 0x40] << 4 |
             local_128[local_24c + local_250 + 0x60] << 6;
      }
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q2_K_ref(const float * GGML_RESTRICT x, block_q2_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[16];
    float   weights[16];
    float mins[QK_K/16];
    float scales[QK_K/16];

    const float q4scale = 15.f;

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            for (int l = 0; l < 16; ++l) weights[l] = fabsf(x[16*j + l]);
            scales[j] = make_qkx2_quants(16, 3, x + 16*j, weights, L + 16*j, &mins[j], Laux, -0.5f, 0.1f, 15, true);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        if (max_scale > 0) {
            float iscale = q4scale/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*scales[j]);
                y[i].scales[j] = l;
            }
            y[i].d = GGML_FP32_TO_FP16(max_scale/q4scale);
        } else {
            for (int j = 0; j < QK_K/16; ++j) y[i].scales[j] = 0;
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }
        if (max_min > 0) {
            float iscale = q4scale/max_min;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*mins[j]);
                y[i].scales[j] |= (l << 4);
            }
            y[i].dmin = GGML_FP32_TO_FP16(max_min/q4scale);
        } else {
            y[i].dmin = GGML_FP32_TO_FP16(0.f);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            const float d = GGML_FP16_TO_FP32(y[i].d) * (y[i].scales[j] & 0xF);
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * (y[i].scales[j] >> 4);
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int((x[16*j + ii] + dm)/d);
                l = MAX(0, MIN(3, l));
                L[16*j + ii] = l;
            }
        }

        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}